

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D_imexmri.c
# Opt level: O3

int ReactionJac(sunrealtype c,N_Vector y,SUNMatrix Jac,UserData udata)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  int iVar10;
  int extraout_EAX;
  long lVar11;
  undefined1 *puVar12;
  long lVar13;
  
  lVar11 = N_VGetArrayPointer();
  iVar10 = (int)lVar11;
  if (lVar11 == 0) {
    ReactionJac_cold_1();
    iVar10 = extraout_EAX;
  }
  else if (2 < (long)udata) {
    lVar6 = *(long *)((long)Jac->content + 0x28);
    lVar7 = *(long *)((long)Jac->content + 0x40);
    puVar12 = (undefined1 *)((long)&udata[-1].ep + 6);
    lVar13 = 0x28;
    do {
      dVar3 = *(double *)(lVar11 + -0x10 + lVar13);
      dVar4 = *(double *)(lVar11 + lVar13);
      lVar8 = *(long *)(lVar7 + -0x10 + lVar13);
      dVar5 = *(double *)(lVar11 + -8 + lVar13);
      pdVar1 = (double *)(lVar8 + lVar6 * 8);
      dVar9 = pdVar1[1];
      pdVar2 = (double *)(lVar8 + lVar6 * 8);
      *pdVar2 = *pdVar1 + -(dVar4 + 1.0) + dVar5 * (dVar3 + dVar3);
      pdVar2[1] = dVar9 + dVar4 + dVar5 * -(dVar3 + dVar3);
      *(double *)(lVar8 + 0x10 + lVar6 * 8) = *(double *)(lVar8 + 0x10 + lVar6 * 8) - dVar4;
      lVar8 = *(long *)(lVar7 + -8 + lVar13);
      *(double *)(lVar8 + -8 + lVar6 * 8) = *(double *)(lVar8 + -8 + lVar6 * 8) + dVar3 * dVar3;
      *(double *)(lVar8 + lVar6 * 8) = *(double *)(lVar8 + lVar6 * 8) - dVar3 * dVar3;
      lVar8 = *(long *)(lVar7 + lVar13);
      *(double *)(lVar8 + -0x10 + lVar6 * 8) = *(double *)(lVar8 + -0x10 + lVar6 * 8) - dVar3;
      pdVar1 = (double *)(lVar8 + -8 + lVar6 * 8);
      dVar4 = pdVar1[1];
      pdVar2 = (double *)(lVar8 + -8 + lVar6 * 8);
      *pdVar2 = dVar3 + *pdVar1;
      pdVar2[1] = (-1.0 / c - dVar3) + dVar4;
      lVar13 = lVar13 + 0x18;
      puVar12 = puVar12 + -1;
    } while (puVar12 != (undefined1 *)0x0);
  }
  return iVar10;
}

Assistant:

static int ReactionJac(sunrealtype c, N_Vector y, SUNMatrix Jac, UserData udata)
{
  sunindextype N = udata->N; /* set shortcuts */
  sunrealtype ep = udata->ep;
  sunindextype i;
  sunrealtype u, v, w;
  sunrealtype* Ydata = N_VGetArrayPointer(y); /* access solution array */
  if (check_retval((void*)Ydata, "N_VGetArrayPointer", 0)) { return 1; }

  /* iterate over nodes, filling in Jacobian of reaction terms */
  for (i = 1; i < N - 1; i++)
  {
    u = Ydata[IDX(i, 0)]; /* set nodal value shortcuts */
    v = Ydata[IDX(i, 1)];
    w = Ydata[IDX(i, 2)];

    /* all vars wrt u */
    SM_ELEMENT_B(Jac, IDX(i, 0), IDX(i, 0)) += c * (TWO * u * v - (w + ONE));
    SM_ELEMENT_B(Jac, IDX(i, 1), IDX(i, 0)) += c * (w - TWO * u * v);
    SM_ELEMENT_B(Jac, IDX(i, 2), IDX(i, 0)) += c * (-w);

    /* all vars wrt v */
    SM_ELEMENT_B(Jac, IDX(i, 0), IDX(i, 1)) += c * (u * u);
    SM_ELEMENT_B(Jac, IDX(i, 1), IDX(i, 1)) += c * (-u * u);

    /* all vars wrt w */
    SM_ELEMENT_B(Jac, IDX(i, 0), IDX(i, 2)) += c * (-u);
    SM_ELEMENT_B(Jac, IDX(i, 1), IDX(i, 2)) += c * (u);
    SM_ELEMENT_B(Jac, IDX(i, 2), IDX(i, 2)) += c * (-ONE / ep - u);
  }

  /* Return with success */
  return 0;
}